

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.hpp
# Opt level: O2

void __thiscall
Atari2600::TIA::Player::dequeue_pixels
          (Player *this,uint8_t *target,uint8_t collision_identity,int time_now)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int output_pixel_position;
  int output_adder;
  int output_reverse_mask;
  uint uVar4;
  
  uVar4 = this->queue_read_pointer_;
  while( true ) {
    if (uVar4 == this->queue_write_pointer_) {
      return;
    }
    iVar2 = this->queue_[(int)uVar4].start;
    iVar3 = this->queue_[(int)uVar4].end;
    output_pixel_position = this->queue_[(int)uVar4].pixel_position;
    output_adder = this->queue_[(int)uVar4].adder;
    output_reverse_mask = this->queue_[(int)uVar4].reverse_mask;
    if (time_now < iVar3) break;
    output_pixels(this,target + iVar2,iVar3 - iVar2,collision_identity,output_pixel_position,
                  output_adder,output_reverse_mask);
    uVar4 = this->queue_read_pointer_ + 1U & 3;
    this->queue_read_pointer_ = uVar4;
  }
  output_pixels(this,target + iVar2,time_now - iVar2,collision_identity,output_pixel_position,
                output_adder,output_reverse_mask);
  iVar3 = this->queue_read_pointer_;
  piVar1 = &this->queue_[iVar3].pixel_position;
  *piVar1 = *piVar1 + (time_now - iVar2) * this->queue_[iVar3].adder;
  this->queue_[iVar3].start = time_now;
  return;
}

Assistant:

void dequeue_pixels(uint8_t *const target, const uint8_t collision_identity, const int time_now) {
				while(queue_read_pointer_ != queue_write_pointer_) {
					uint8_t *const start_ptr = &target[queue_[queue_read_pointer_].start];
					if(queue_[queue_read_pointer_].end > time_now) {
						const int length = time_now - queue_[queue_read_pointer_].start;
						output_pixels(start_ptr, length, collision_identity, queue_[queue_read_pointer_].pixel_position, queue_[queue_read_pointer_].adder, queue_[queue_read_pointer_].reverse_mask);
						queue_[queue_read_pointer_].pixel_position += length * queue_[queue_read_pointer_].adder;
						queue_[queue_read_pointer_].start = time_now;
						return;
					} else {
						output_pixels(start_ptr, queue_[queue_read_pointer_].end - queue_[queue_read_pointer_].start, collision_identity, queue_[queue_read_pointer_].pixel_position, queue_[queue_read_pointer_].adder, queue_[queue_read_pointer_].reverse_mask);
					}
					queue_read_pointer_ = (queue_read_pointer_ + 1)&3;
				}
			}